

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O2

void hermite_poly_phys_coef(int n,double *c)

{
  long lVar1;
  ulong uVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  double dVar10;
  
  if (-1 < n) {
    uVar2 = (ulong)(uint)n;
    lVar1 = uVar2 + 1;
    pdVar3 = c;
    for (lVar4 = 0; pdVar6 = pdVar3, lVar5 = lVar1, lVar4 != lVar1; lVar4 = lVar4 + 1) {
      while (lVar5 != 0) {
        *pdVar6 = 0.0;
        pdVar6 = pdVar6 + uVar2 + 1;
        lVar5 = lVar5 + -1;
      }
      pdVar3 = pdVar3 + 1;
    }
    *c = 1.0;
    if (n != 0) {
      c[uVar2 + 2] = 2.0;
      lVar4 = (long)(int)lVar1;
      pdVar3 = c + 1;
      lVar7 = 0;
      for (lVar5 = 2; lVar5 != lVar1; lVar5 = lVar5 + 1) {
        dVar10 = (double)(int)(lVar5 + -1) * -2.0;
        c[lVar5] = c[lVar5 + -2] * dVar10;
        pdVar6 = pdVar3;
        lVar8 = lVar7;
        while (bVar9 = lVar8 != 0, lVar8 = lVar8 + -1, bVar9) {
          pdVar6[lVar4 + 1] = *pdVar6 + *pdVar6 + pdVar6[lVar4 + -1] * dVar10;
          pdVar6 = pdVar6 + lVar4;
        }
        lVar8 = (lVar5 + -1) * lVar4;
        c[lVar8 + lVar5] =
             c[(lVar5 + -2) * lVar4 + lVar5 + -1] + c[(lVar5 + -2) * lVar4 + lVar5 + -1];
        c[(n + 2) * (int)lVar5] = c[lVar8 + lVar5 + -1] + c[lVar8 + lVar5 + -1];
        lVar7 = lVar7 + 1;
        pdVar3 = pdVar3 + 1;
      }
    }
  }
  return;
}

Assistant:

void hermite_poly_phys_coef ( int n, double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    HERMITE_POLY_PHYS_COEF: coefficients of the physicist's Hermite polynomial H(n,x).
//
//  First terms:
//
//    N/K     0     1      2      3       4     5      6    7      8    9   10
//
//     0      1
//     1      0     2
//     2     -2     0      4
//     3      0   -12      0      8
//     4     12     0    -48      0      16
//     5      0   120      0   -160       0    32
//     6   -120     0    720      0    -480     0     64
//     7      0 -1680      0   3360       0 -1344      0   128
//     8   1680     0 -13440      0   13440     0  -3584     0    256
//     9      0 30240      0 -80640       0 48384      0 -9216      0 512
//    10 -30240     0 302400      0 -403200     0 161280     0 -23040   0 1024
//
//  Recursion:
//
//    H(0,X) = 1,
//    H(1,X) = 2*X,
//    H(N,X) = 2*X * H(N-1,X) - 2*(N-1) * H(N-2,X)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    14 May 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input, int N, the highest order polynomial to compute.
//    Note that polynomials 0 through N will be computed.
//
//    Output, double C[(N+1)*(N+1)], the coefficients of the Hermite
//    polynomials.
//
{
  int i;
  int j;

  if ( n < 0 )
  {
    return;
  }

  for ( i = 0; i <= n; i++ )
  {
    for ( j = 0; j <= n; j++ )
    {
      c[i+j*(n+1)] = 0.0;
    }
  }

  c[0+0*(n+1)] = 1.0;

  if ( n == 0 )
  {
    return;
  }

  c[1+1*(n+1)] = 2.0;

  for ( i = 2; i <= n; i++ )
  {
    c[i+0*(n+1)] = - 2.0 * double( i - 1 ) * c[i-2+0*(n+1)];
    for ( j = 1; j <= i-2; j++ )
    {
      c[i+j*(n+1)] =   2.0 * c[i-1+(j-1)*(n+1)] 
                     - 2.0 * double( i - 1 ) * c[i-2+j*(n+1)];
    }
    c[i+(i-1)*(n+1)] =  2.0 * c[i-1+(i-2)*(n+1)];
    c[i+ i   *(n+1)] =  2.0 * c[i-1+(i-1)*(n+1)];
  }

  return;
}